

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::read_ktx(mipmapped_texture *this,data_stream_serializer *serializer)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  uint new_size;
  uint32 uVar4;
  pixel_format pVar5;
  component_flags cVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  vector<crnlib::mip_level_*> *pvVar12;
  mip_level *this_00;
  mip_level **ppmVar13;
  uint8_vec *this_01;
  dxt_image *this_02;
  element_vec *this_03;
  element *__dest;
  uchar *__src;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_04;
  color_quad<unsigned_char,_int> local_188;
  uint local_184;
  color_quad_u8 c;
  uint x;
  uint y;
  color_quad_u8 q;
  uint8 *pSrc;
  image_u8 *pImage;
  dxt_image *pDXTImage;
  uint level_pitch;
  uint num_blocks_y;
  uint num_blocks_x;
  uint bytes_per_block;
  vector<unsigned_char> *image_data;
  mip_level *pMip;
  uint height;
  uint width;
  uint level_index;
  uint face_index;
  undefined1 local_128 [3];
  bool dxt1_alpha;
  orientation_flags_t orient_flags;
  dynamic_string orient;
  bool y_flipped;
  bool x_flipped;
  uint type_bits;
  uint type_size;
  pixel_packer unpacker;
  dxt_format dxt_fmt;
  undefined1 local_c0 [3];
  bool is_compressed_texture;
  int i;
  dynamic_string crnlib_fourcc_str;
  uint32 crnlib_fourcc;
  uint num_faces;
  uint num_mip_levels;
  undefined1 local_90 [8];
  ktx_texture kt;
  data_stream_serializer *serializer_local;
  mipmapped_texture *this_local;
  
  kt._104_8_ = serializer;
  clear(this);
  set_last_error(this,"Unable to read KTX file");
  ktx_texture::ktx_texture((ktx_texture *)local_90);
  bVar1 = ktx_texture::read_from_stream
                    ((ktx_texture *)local_90,(data_stream_serializer *)kt._104_8_);
  if (!bVar1) {
    this_local._7_1_ = false;
    goto LAB_0014c089;
  }
  uVar3 = ktx_texture::get_depth((ktx_texture *)local_90);
  if ((1 < uVar3) || (uVar3 = ktx_texture::get_array_size((ktx_texture *)local_90), 1 < uVar3)) {
    set_last_error(this,"read_ktx: Depth and array textures are not supported");
    this_local._7_1_ = false;
    goto LAB_0014c089;
  }
  uVar3 = ktx_texture::get_width((ktx_texture *)local_90);
  this->m_width = uVar3;
  uVar3 = ktx_texture::get_height((ktx_texture *)local_90);
  this->m_height = uVar3;
  uVar3 = ktx_texture::get_num_mips((ktx_texture *)local_90);
  new_size = ktx_texture::get_num_faces((ktx_texture *)local_90);
  crnlib_fourcc_str.m_pStr._4_4_ = PIXEL_FMT_INVALID;
  dynamic_string::dynamic_string((dynamic_string *)local_c0);
  bVar1 = ktx_texture::get_key_value_as_string
                    ((ktx_texture *)local_90,"CRNLIB_FOURCC",(dynamic_string *)local_c0);
  if ((bVar1) && (uVar7 = dynamic_string::get_len((dynamic_string *)local_c0), uVar7 == 4)) {
    for (dxt_fmt = cDXT5; cDXTInvalid < dxt_fmt; dxt_fmt = dxt_fmt + cDXTInvalid) {
      pVar5 = crnlib_fourcc_str.m_pStr._4_4_ << 8;
      cVar2 = dynamic_string::operator[]((dynamic_string *)local_c0,dxt_fmt);
      crnlib_fourcc_str.m_pStr._4_4_ = pVar5 | (int)cVar2;
    }
  }
  unpacker._59_1_ = ktx_texture::is_compressed((ktx_texture *)local_90);
  unpacker.m_comp_max[3] = 0xffffffff;
  pixel_packer::pixel_packer((pixel_packer *)&type_bits);
  if ((unpacker._59_1_ & 1) == 0) {
    this->m_format = PIXEL_FMT_A8R8G8B8;
    uVar4 = ktx_texture::get_ogl_type((ktx_texture *)local_90);
    get_ogl_type_size(uVar4);
    uVar4 = ktx_texture::get_ogl_type((ktx_texture *)local_90);
    bVar1 = is_packed_pixel_ogl_type(uVar4);
    if (bVar1) {
      uVar4 = ktx_texture::get_ogl_type((ktx_texture *)local_90);
      if (uVar4 == 0x8032) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"B2G3R3");
        this->m_format = PIXEL_FMT_R8G8B8;
      }
      else if (uVar4 == 0x8033) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"A4B4G4R4");
      }
      else if (uVar4 == 0x8034) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"A1B5G5R5");
      }
      else if (uVar4 == 0x8035) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"A8B8G8R8");
      }
      else if (uVar4 == 0x8036) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"A2B10G10R10");
      }
      else if (uVar4 == 0x8362) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"R3G3B2");
        this->m_format = PIXEL_FMT_R8G8B8;
      }
      else if (uVar4 == 0x8363) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"B5G6R5");
        this->m_format = PIXEL_FMT_R8G8B8;
      }
      else if (uVar4 == 0x8364) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"R5G6B5");
        this->m_format = PIXEL_FMT_R8G8B8;
      }
      else if (uVar4 == 0x8365) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"R4G4B4A4");
      }
      else if (uVar4 == 0x8366) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"R5G5B5A1");
      }
      else if (uVar4 == 0x8367) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"R8G8B8A8");
      }
      else if (uVar4 == 0x8368) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"R10G10B10A2");
      }
      else {
        if (uVar4 != 0x8c3e) {
          set_last_error(this,"Unsupported KTX packed pixel type");
          this_local._7_1_ = false;
          goto LAB_0014c06d;
        }
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"R9G9B9A5");
      }
      uVar4 = ktx_texture::get_ogl_type((ktx_texture *)local_90);
      uVar7 = get_ogl_type_size(uVar4);
      pixel_packer::set_pixel_stride((pixel_packer *)&type_bits,uVar7);
    }
    else {
      uVar4 = ktx_texture::get_ogl_fmt((ktx_texture *)local_90);
      if (uVar4 == 1) goto LAB_0014b57b;
      if (uVar4 == 2) goto LAB_0014b67a;
      if (uVar4 == 3) goto LAB_0014b6e0;
      if (uVar4 == 4) goto LAB_0014b743;
      if (uVar4 == 0x1903) goto LAB_0014b57b;
      if (uVar4 == 0x1904) {
LAB_0014b5ae:
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)0x22b3f4);
        this->m_format = PIXEL_FMT_R8G8B8;
      }
      else if (uVar4 == 0x1905) {
LAB_0014b5e1:
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)0x22b3fb);
        this->m_format = PIXEL_FMT_R8G8B8;
      }
      else if (uVar4 == 0x1906) {
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)0x22992d);
        this->m_format = PIXEL_FMT_A8;
      }
      else if (uVar4 == 0x1907) {
LAB_0014b6e0:
        pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"RGB");
        this->m_format = PIXEL_FMT_R8G8B8;
      }
      else {
        if (uVar4 == 0x1908) goto LAB_0014b743;
        if (uVar4 == 0x1909) {
          pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)0x22993f);
          this->m_format = PIXEL_FMT_L8;
        }
        else if (uVar4 == 0x190a) {
          pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"YA");
          this->m_format = PIXEL_FMT_A8L8;
        }
        else {
          if (uVar4 == 0x8051) goto LAB_0014b6e0;
          if (uVar4 == 0x8058) goto LAB_0014b743;
          if (uVar4 == 0x80e0) {
LAB_0014b713:
            pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"BGR");
            this->m_format = PIXEL_FMT_R8G8B8;
          }
          else if (uVar4 == 0x80e1) {
LAB_0014b765:
            pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"BGRA");
          }
          else if (uVar4 - 0x8227 < 2) {
LAB_0014b67a:
            pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"RG");
            this->m_format = PIXEL_FMT_A8L8;
          }
          else {
            if (uVar4 != 0x8229) {
              if (uVar4 == 0x822b) goto LAB_0014b67a;
              if (uVar4 != 0x8232) {
                if (uVar4 - 0x8c40 < 2) goto LAB_0014b6e0;
                if (1 < uVar4 - 0x8c42) {
                  if (uVar4 == 0x8d94) goto LAB_0014b57b;
                  if (uVar4 == 0x8d95) goto LAB_0014b5ae;
                  if (uVar4 == 0x8d96) goto LAB_0014b5e1;
                  if (uVar4 == 0x8d98) goto LAB_0014b6e0;
                  if (uVar4 != 0x8d99) {
                    if (uVar4 == 0x8d9a) goto LAB_0014b713;
                    if (uVar4 != 0x8d9b) {
                      set_last_error(this,"Unsupported KTX pixel format");
                      this_local._7_1_ = false;
                      goto LAB_0014c06d;
                    }
                    goto LAB_0014b765;
                  }
                }
LAB_0014b743:
                pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)"RGBA");
                goto LAB_0014b7af;
              }
            }
LAB_0014b57b:
            pixel_packer::init((pixel_packer *)&type_bits,(EVP_PKEY_CTX *)0x22baac);
            this->m_format = PIXEL_FMT_R8G8B8;
          }
        }
      }
LAB_0014b7af:
      uVar7 = pixel_packer::get_num_comps((pixel_packer *)&type_bits);
      uVar4 = ktx_texture::get_ogl_type((ktx_texture *)local_90);
      uVar10 = get_ogl_type_size(uVar4);
      pixel_packer::set_pixel_stride((pixel_packer *)&type_bits,uVar7 * uVar10);
    }
LAB_0014b80b:
    cVar6 = pixel_format_helpers::get_component_flags(this->m_format);
    this->m_comp_flags = cVar6;
    vector<crnlib::vector<crnlib::mip_level_*>_>::resize(&this->m_faces,new_size,false);
    orient.m_pStr._7_1_ = 0;
    orient.m_pStr._6_1_ = 1;
    dynamic_string::dynamic_string((dynamic_string *)local_128);
    bVar1 = ktx_texture::get_key_value_as_string
                      ((ktx_texture *)local_90,"KTXorientation",(dynamic_string *)local_128);
    if ((((bVar1) && (uVar7 = dynamic_string::get_len((dynamic_string *)local_128), 6 < uVar7)) &&
        ((cVar2 = dynamic_string::operator[]((dynamic_string *)local_128,0), cVar2 == 'S' &&
         ((cVar2 = dynamic_string::operator[]((dynamic_string *)local_128,1), cVar2 == '=' &&
          (cVar2 = dynamic_string::operator[]((dynamic_string *)local_128,3), cVar2 == ',')))))) &&
       ((cVar2 = dynamic_string::operator[]((dynamic_string *)local_128,4), cVar2 == 'T' &&
        (cVar2 = dynamic_string::operator[]((dynamic_string *)local_128,5), cVar2 == '=')))) {
      cVar2 = dynamic_string::operator[]((dynamic_string *)local_128,2);
      iVar11 = tolower((int)cVar2);
      if (iVar11 == 0x6c) {
        orient.m_pStr._7_1_ = 1;
      }
      else {
        cVar2 = dynamic_string::operator[]((dynamic_string *)local_128,2);
        iVar11 = tolower((int)cVar2);
        if (iVar11 == 0x72) {
          orient.m_pStr._7_1_ = 0;
        }
      }
      cVar2 = dynamic_string::operator[]((dynamic_string *)local_128,6);
      iVar11 = tolower((int)cVar2);
      if (iVar11 == 0x75) {
        orient.m_pStr._6_1_ = 1;
      }
      else {
        cVar2 = dynamic_string::operator[]((dynamic_string *)local_128,6);
        iVar11 = tolower((int)cVar2);
        if (iVar11 == 100) {
          orient.m_pStr._6_1_ = 0;
        }
      }
    }
    face_index = (uint)((orient.m_pStr._7_1_ & 1) != 0);
    if ((orient.m_pStr._6_1_ & 1) != 0) {
      face_index = face_index | 2;
    }
    level_index._3_1_ = 0;
    for (width = 0; width < new_size; width = width + 1) {
      pvVar12 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,width);
      vector<crnlib::mip_level_*>::resize(pvVar12,uVar3,false);
      for (height = 0; height < uVar3; height = height + 1) {
        pMip._4_4_ = math::maximum<unsigned_int>(this->m_width >> ((byte)height & 0x1f),1);
        pMip._0_4_ = math::maximum<unsigned_int>(this->m_height >> ((byte)height & 0x1f),1);
        this_00 = crnlib_new<crnlib::mip_level>();
        pvVar12 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,width);
        ppmVar13 = vector<crnlib::mip_level_*>::operator[](pvVar12,height);
        *ppmVar13 = this_00;
        this_01 = ktx_texture::get_image_data((ktx_texture *)local_90,height,0,width,0);
        if ((unpacker._59_1_ & 1) == 0) {
          uVar7 = vector<unsigned_char>::size(this_01);
          iVar11 = pMip._4_4_ * pMip._0_4_;
          uVar10 = pixel_packer::get_pixel_stride((pixel_packer *)&type_bits);
          if (uVar7 != iVar11 * uVar10) {
            this_local._7_1_ = false;
            goto LAB_0014c061;
          }
          this_04 = crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,unsigned_int,unsigned_int>
                              ((crnlib *)((long)&pMip + 4),(uint *)&pMip,(uint *)(ulong)uVar10);
          image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags(this_04,this->m_comp_flags)
          ;
          _y = vector<unsigned_char>::get_ptr(this_01);
          color_quad<unsigned_char,_int>::color_quad
                    ((color_quad<unsigned_char,_int> *)&x,0,0,0,0xff);
          for (c.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                           (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                            )0x0; (uint)c.field_0 < pMip._0_4_;
              c.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                          ((int)c.field_0 + 1)) {
            for (local_184 = 0; local_184 < pMip._4_4_; local_184 = local_184 + 1) {
              color_quad<unsigned_char,_int>::color_quad(&local_188);
              _y = (uchar *)pixel_packer::unpack<crnlib::color_quad<unsigned_char,int>>
                                      ((pixel_packer *)&type_bits,_y,&local_188,true);
              image<crnlib::color_quad<unsigned_char,_int>_>::set_pixel_unclipped
                        (this_04,local_184,(uint)c.field_0,&local_188);
            }
          }
          mip_level::assign(this_00,this_04,this->m_format,face_index);
        }
        else {
          uVar7 = pixel_format_helpers::get_dxt_bytes_per_block(this->m_format);
          uVar8 = pMip._4_4_ + 3;
          uVar9 = pMip._0_4_ + 3;
          uVar10 = vector<unsigned_char>::size(this_01);
          if (uVar10 != (uVar8 >> 2) * (uVar9 >> 2) * uVar7) {
            this_local._7_1_ = false;
            goto LAB_0014c061;
          }
          this_02 = crnlib_new<crnlib::dxt_image>();
          uVar8 = dxt_image::init(this_02,(EVP_PKEY_CTX *)(ulong)unpacker.m_comp_max[3]);
          if ((uVar8 & 1) == 0) {
            crnlib_delete<crnlib::dxt_image>(this_02);
            this_local._7_1_ = false;
            goto LAB_0014c061;
          }
          this_03 = dxt_image::get_element_vec(this_02);
          __dest = vector<crnlib::dxt_image::element>::operator[](this_03,0);
          __src = vector<unsigned_char>::get_ptr(this_01);
          uVar7 = vector<unsigned_char>::size(this_01);
          memcpy(__dest,__src,(ulong)uVar7);
          if ((this->m_format == PIXEL_FMT_DXT1) && ((level_index._3_1_ & 1) == 0)) {
            level_index._3_1_ = dxt_image::has_alpha(this_02);
          }
          mip_level::assign(this_00,this_02,this->m_format,face_index);
        }
      }
    }
    clear_last_error(this);
    if ((level_index._3_1_ & 1) != 0) {
      change_dxt1_to_dxt1a(this);
    }
    this_local._7_1_ = true;
LAB_0014c061:
    dynamic_string::~dynamic_string((dynamic_string *)local_128);
  }
  else {
    uVar4 = ktx_texture::get_ogl_internal_fmt((ktx_texture *)local_90);
    if (uVar4 - 0x83a0 < 2) {
LAB_0014ae24:
      unpacker.m_comp_max[3] = 0;
    }
    else if (uVar4 - 0x83a2 < 2) {
LAB_0014ae3c:
      unpacker.m_comp_max[3] = 2;
    }
    else if (uVar4 - 0x83a4 < 2) {
LAB_0014ae48:
      unpacker.m_comp_max[3] = 3;
    }
    else {
      if (uVar4 == 0x83f0) goto LAB_0014ae24;
      if (uVar4 == 0x83f1) {
LAB_0014ae30:
        unpacker.m_comp_max[3] = 1;
      }
      else {
        if (uVar4 == 0x83f2) goto LAB_0014ae3c;
        if (uVar4 == 0x83f3) goto LAB_0014ae48;
        if (uVar4 == 0x8c4c) goto LAB_0014ae24;
        if (uVar4 == 0x8c4d) goto LAB_0014ae30;
        if (uVar4 == 0x8c4e) goto LAB_0014ae3c;
        if (uVar4 == 0x8c4f) goto LAB_0014ae48;
        if (uVar4 == 0x8c70) {
          unpacker.m_comp_max[3] = 4;
        }
        else if (uVar4 == 0x8d64) {
          unpacker.m_comp_max[3] = 7;
        }
        else if (uVar4 == 0x8dbe) {
          unpacker.m_comp_max[3] = 6;
          if (crnlib_fourcc_str.m_pStr._4_4_ == PIXEL_FMT_DXN) {
            unpacker.m_comp_max[3] = 5;
          }
        }
        else if (uVar4 == 0x9274) {
          unpacker.m_comp_max[3] = 8;
        }
        else {
          if (uVar4 != 0x9278) {
            set_last_error(this,"Unsupported KTX internal format");
            this_local._7_1_ = false;
            goto LAB_0014c06d;
          }
          unpacker.m_comp_max[3] = 9;
        }
      }
    }
    pVar5 = pixel_format_helpers::from_dxt_format(unpacker.m_comp_max[3]);
    this->m_format = pVar5;
    if (this->m_format != PIXEL_FMT_INVALID) {
      if (((crnlib_fourcc_str.m_pStr._4_4_ != PIXEL_FMT_INVALID) &&
          ((((crnlib_fourcc_str.m_pStr._4_4_ == PIXEL_FMT_DXT5_AGBR ||
             (crnlib_fourcc_str.m_pStr._4_4_ == PIXEL_FMT_DXT5_xGBR)) ||
            (crnlib_fourcc_str.m_pStr._4_4_ == PIXEL_FMT_DXT5_xGxR)) ||
           (crnlib_fourcc_str.m_pStr._4_4_ == PIXEL_FMT_DXT5_CCxY)))) &&
         (unpacker.m_comp_max[3] == 3)) {
        this->m_format = crnlib_fourcc_str.m_pStr._4_4_;
      }
      goto LAB_0014b80b;
    }
    set_last_error(this,"Unsupported KTX internal compressed format");
    this_local._7_1_ = false;
  }
LAB_0014c06d:
  dynamic_string::~dynamic_string((dynamic_string *)local_c0);
LAB_0014c089:
  ktx_texture::~ktx_texture((ktx_texture *)local_90);
  return this_local._7_1_;
}

Assistant:

bool mipmapped_texture::read_ktx(data_stream_serializer& serializer) {
  clear();

  set_last_error("Unable to read KTX file");

  ktx_texture kt;
  if (!kt.read_from_stream(serializer))
    return false;

  if ((kt.get_depth() > 1) || (kt.get_array_size() > 1)) {
    set_last_error("read_ktx: Depth and array textures are not supported");
    return false;
  }

  // Must be 1D, 2D, or a cubemap, with or without mipmaps.
  m_width = kt.get_width();
  m_height = kt.get_height();

  uint num_mip_levels = kt.get_num_mips();
  uint num_faces = kt.get_num_faces();

  uint32 crnlib_fourcc = 0;
  dynamic_string crnlib_fourcc_str;
  if (kt.get_key_value_as_string("CRNLIB_FOURCC", crnlib_fourcc_str)) {
    if (crnlib_fourcc_str.get_len() == 4) {
      for (int i = 3; i >= 0; i--)
        crnlib_fourcc = (crnlib_fourcc << 8) | crnlib_fourcc_str[i];
    }
  }

  const bool is_compressed_texture = kt.is_compressed();
  dxt_format dxt_fmt = cDXTInvalid;

  pixel_packer unpacker;
  if (is_compressed_texture) {
    switch (kt.get_ogl_internal_fmt()) {
      case KTX_ETC1_RGB8_OES:
        dxt_fmt = cETC1;
        break;
      case KTX_COMPRESSED_RGB8_ETC2:
        dxt_fmt = cETC2;
        break;
      case KTX_COMPRESSED_RGBA8_ETC2_EAC:
        dxt_fmt = cETC2A;
        break;
      case KTX_RGB_S3TC:
      case KTX_RGB4_S3TC:
      case KTX_COMPRESSED_RGB_S3TC_DXT1_EXT:
      case KTX_COMPRESSED_SRGB_S3TC_DXT1_EXT:
        dxt_fmt = cDXT1;
        break;
      case KTX_COMPRESSED_RGBA_S3TC_DXT1_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT1_EXT:
        dxt_fmt = cDXT1A;
        break;
      case KTX_RGBA_S3TC:
      case KTX_RGBA4_S3TC:
      case KTX_COMPRESSED_RGBA_S3TC_DXT3_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT3_EXT:
        dxt_fmt = cDXT3;
        break;
      case KTX_COMPRESSED_RGBA_S3TC_DXT5_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT5_EXT:
      case KTX_RGBA_DXT5_S3TC:
      case KTX_RGBA4_DXT5_S3TC:
        dxt_fmt = cDXT5;
        break;
      case KTX_COMPRESSED_SIGNED_RED_GREEN_RGTC2_EXT:
        dxt_fmt = cDXN_YX;
        if (crnlib_fourcc == PIXEL_FMT_DXN) {
          dxt_fmt = cDXN_XY;
        }
        break;
      case KTX_COMPRESSED_LUMINANCE_LATC1_EXT:
        dxt_fmt = cDXT5A;
        break;
      default:
        set_last_error("Unsupported KTX internal format");
        return false;
    }

    m_format = pixel_format_helpers::from_dxt_format(dxt_fmt);
    if (m_format == PIXEL_FMT_INVALID) {
      set_last_error("Unsupported KTX internal compressed format");
      return false;
    }

    if (crnlib_fourcc != 0) {
      switch (crnlib_fourcc) {
        case PIXEL_FMT_DXT5_CCxY:
        case PIXEL_FMT_DXT5_xGxR:
        case PIXEL_FMT_DXT5_xGBR:
        case PIXEL_FMT_DXT5_AGBR: {
          if (dxt_fmt == cDXT5) {
            m_format = static_cast<pixel_format>(crnlib_fourcc);
          }
          break;
        }
      }
    }
  } else {
    m_format = PIXEL_FMT_A8R8G8B8;
    const uint type_size = get_ogl_type_size(kt.get_ogl_type());
    const uint type_bits = type_size * 8;

    // Normal component order:   1,2,3,4 (*last* component packed into LSB of output type)
    // Reversed component order: 4,3,2,1 (*first* component packed into LSB of output type)

    if (is_packed_pixel_ogl_type(kt.get_ogl_type())) {
      switch (kt.get_ogl_type()) {
        // 24bpp packed formats
        case KTX_UNSIGNED_BYTE_3_3_2:
          unpacker.init("B2G3R3");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_BYTE_2_3_3_REV:
          unpacker.init("R3G3B2");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_SHORT_5_6_5:
          unpacker.init("B5G6R5");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_SHORT_5_6_5_REV:
          unpacker.init("R5G6B5");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        // 32bpp packed formats
        case KTX_UNSIGNED_SHORT_4_4_4_4:
          unpacker.init("A4B4G4R4");
          break;
        case KTX_UNSIGNED_SHORT_4_4_4_4_REV:
          unpacker.init("R4G4B4A4");
          break;
        case KTX_UNSIGNED_SHORT_5_5_5_1:
          unpacker.init("A1B5G5R5");
          break;
        case KTX_UNSIGNED_SHORT_1_5_5_5_REV:
          unpacker.init("R5G5B5A1");
          break;
        case KTX_UNSIGNED_INT_8_8_8_8:
          unpacker.init("A8B8G8R8");
          break;
        case KTX_UNSIGNED_INT_8_8_8_8_REV:
          unpacker.init("R8G8B8A8");
          break;
        case KTX_UNSIGNED_INT_10_10_10_2:
          unpacker.init("A2B10G10R10");
          break;
        case KTX_UNSIGNED_INT_2_10_10_10_REV:
          unpacker.init("R10G10B10A2");
          break;
        case KTX_UNSIGNED_INT_5_9_9_9_REV:
          unpacker.init("R9G9B9A5");
          break;
        default:
          set_last_error("Unsupported KTX packed pixel type");
          return false;
      }

      unpacker.set_pixel_stride(get_ogl_type_size(kt.get_ogl_type()));
    } else {
      switch (kt.get_ogl_fmt()) {
        case 1:
        case KTX_RED:
        case KTX_RED_INTEGER:
        case KTX_R8:
        case KTX_R8UI: {
          unpacker.init("R", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_GREEN:
        case KTX_GREEN_INTEGER: {
          unpacker.init("G", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_BLUE:
        case KTX_BLUE_INTEGER: {
          unpacker.init("B", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_ALPHA: {
          unpacker.init("A", -1, type_bits);
          m_format = PIXEL_FMT_A8;
          break;
        }
        case KTX_LUMINANCE: {
          unpacker.init("Y", -1, type_bits);
          m_format = PIXEL_FMT_L8;
          break;
        }
        case 2:
        case KTX_RG:
        case KTX_RG8:
        case KTX_RG_INTEGER: {
          unpacker.init("RG", -1, type_bits);
          m_format = PIXEL_FMT_A8L8;
          break;
        }
        case KTX_LUMINANCE_ALPHA: {
          unpacker.init("YA", -1, type_bits);
          m_format = PIXEL_FMT_A8L8;
          break;
        }
        case 3:
        case KTX_SRGB:
        case KTX_RGB:
        case KTX_RGB_INTEGER:
        case KTX_RGB8:
        case KTX_SRGB8: {
          unpacker.init("RGB", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_BGR:
        case KTX_BGR_INTEGER: {
          unpacker.init("BGR", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case 4:
        case KTX_RGBA_INTEGER:
        case KTX_RGBA:
        case KTX_SRGB_ALPHA:
        case KTX_SRGB8_ALPHA8:
        case KTX_RGBA8: {
          unpacker.init("RGBA", -1, type_bits);
          break;
        }
        case KTX_BGRA:
        case KTX_BGRA_INTEGER: {
          unpacker.init("BGRA", -1, type_bits);
          break;
        }
        default:
          set_last_error("Unsupported KTX pixel format");
          return false;
      }

      unpacker.set_pixel_stride(unpacker.get_num_comps() * get_ogl_type_size(kt.get_ogl_type()));
    }

    CRNLIB_ASSERT(unpacker.is_valid());
  }

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  m_faces.resize(num_faces);

  bool x_flipped = false;
  bool y_flipped = true;

  dynamic_string orient;
  if ((kt.get_key_value_as_string("KTXorientation", orient)) && (orient.get_len() >= 7)) {
    //  0123456
    // "S=r,T=d"
    if ((orient[0] == 'S') && (orient[1] == '=') && (orient[3] == ',') &&
        (orient[4] == 'T') && (orient[5] == '=')) {
      if (tolower(orient[2]) == 'l')
        x_flipped = true;
      else if (tolower(orient[2]) == 'r')
        x_flipped = false;

      if (tolower(orient[6]) == 'u')
        y_flipped = true;
      else if (tolower(orient[6]) == 'd')
        y_flipped = false;
    }
  }

  orientation_flags_t orient_flags = cDefaultOrientationFlags;
  if (x_flipped)
    orient_flags = static_cast<orientation_flags_t>(orient_flags | cOrientationFlagXFlipped);
  if (y_flipped)
    orient_flags = static_cast<orientation_flags_t>(orient_flags | cOrientationFlagYFlipped);

  bool dxt1_alpha = false;

  for (uint face_index = 0; face_index < num_faces; face_index++) {
    m_faces[face_index].resize(num_mip_levels);

    for (uint level_index = 0; level_index < num_mip_levels; level_index++) {
      const uint width = math::maximum<uint>(m_width >> level_index, 1U);
      const uint height = math::maximum<uint>(m_height >> level_index, 1U);

      mip_level* pMip = crnlib_new<mip_level>();
      m_faces[face_index][level_index] = pMip;

      const crnlib::vector<uint8>& image_data = kt.get_image_data(level_index, 0, face_index, 0);

      if (is_compressed_texture) {
        const uint bytes_per_block = pixel_format_helpers::get_dxt_bytes_per_block(m_format);

        const uint num_blocks_x = (width + 3) >> 2;
        const uint num_blocks_y = (height + 3) >> 2;

        const uint level_pitch = num_blocks_x * num_blocks_y * bytes_per_block;
        if (image_data.size() != level_pitch)
          return false;

        dxt_image* pDXTImage = crnlib_new<dxt_image>();
        if (!pDXTImage->init(dxt_fmt, width, height, false)) {
          crnlib_delete(pDXTImage);

          CRNLIB_ASSERT(0);
          return false;
        }

        CRNLIB_ASSERT(pDXTImage->get_element_vec().size() * sizeof(dxt_image::element) == level_pitch);

        memcpy(&pDXTImage->get_element_vec()[0], image_data.get_ptr(), image_data.size());

        if ((m_format == PIXEL_FMT_DXT1) && (!dxt1_alpha))
          dxt1_alpha = pDXTImage->has_alpha();

        pMip->assign(pDXTImage, m_format, orient_flags);
      } else {
        if (image_data.size() != (width * height * unpacker.get_pixel_stride()))
          return false;

        image_u8* pImage = crnlib_new<image_u8>(width, height);

        pImage->set_comp_flags(m_comp_flags);

        const uint8* pSrc = image_data.get_ptr();

        color_quad_u8 q(0, 0, 0, 255);

        for (uint y = 0; y < height; y++) {
          for (uint x = 0; x < width; x++) {
            color_quad_u8 c;
            pSrc = static_cast<const uint8*>(unpacker.unpack(pSrc, c));
            pImage->set_pixel_unclipped(x, y, c);
          }
        }

        pMip->assign(pImage, m_format, orient_flags);

        CRNLIB_ASSERT(pMip->get_comp_flags() == m_comp_flags);
      }
    }
  }

  clear_last_error();

  if (dxt1_alpha)
    change_dxt1_to_dxt1a();

  return true;
}